

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_function.hpp
# Opt level: O2

double sisl::basis_function::convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                 (vector *p,cartesian_cubic<float> *lattice,double *h)

{
  int iVar1;
  undefined4 extraout_var;
  DenseStorage<int,__1,__1,_1,_0> *other;
  lattice_site c;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  sites;
  lattice_site s;
  lattice_site extent;
  double local_120;
  void *local_118 [2];
  double local_108;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_100;
  DenseStorage<int,__1,__1,_1,_0> *local_f8;
  vector local_f0;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  local_e0;
  void *local_c8;
  LhsNested local_c0;
  RhsNested pMStack_b8;
  DenseStorage<int,__1,__1,_1,_0> local_a0;
  void *local_90 [2];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_80;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
  local_68;
  
  tp_linear::get_integer_support<3>();
  local_100 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)p;
  (*(lattice->super_base_lattice<float>)._vptr_base_lattice[0xe])(local_118,lattice,p);
  (*(lattice->super_base_lattice<float>)._vptr_base_lattice[10])(local_90,lattice);
  local_f8 = (DenseStorage<int,__1,__1,_1,_0> *)
             local_e0.
             super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_120 = 0.0;
  for (other = (DenseStorage<int,__1,__1,_1,_0> *)
               local_e0.
               super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start; other != local_f8; other = other + 1) {
    Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage(&local_a0,other);
    Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                *)&local_68,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_118,
               (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_a0);
    Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_c8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                *)&local_68);
    iVar1 = (*(lattice->super_base_lattice<float>)._vptr_base_lattice[0x11])
                      (lattice,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_c8);
    free(local_c8);
    if ((char)iVar1 != '\0') {
      Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                  *)&local_68,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_118,
                 (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_a0);
      Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_c8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_68);
      iVar1 = (*(lattice->super_base_lattice<float>)._vptr_base_lattice[0x14])
                        (lattice,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_c8);
      free(local_c8);
      if ((char)iVar1 != '\0') {
        Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                  (&local_80,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_118,
                   (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_a0);
        local_c0 = local_80.m_lhs;
        pMStack_b8 = local_80.m_rhs;
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  (&local_68,local_100,
                   (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
                    *)&local_c8);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_f0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>_>
                    *)&local_68);
        local_108 = tp_linear::phi<3>(&local_f0);
        free(local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        if ((local_108 != 0.0) || (NAN(local_108))) {
          Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                    ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                      *)&local_68,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_118,
                     (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_a0);
          Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                    ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_c8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                      *)&local_68);
          iVar1 = (*(lattice->super_base_lattice<float>)._vptr_base_lattice[5])
                            (lattice,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_c8);
          local_120 = local_120 + local_108 * (double)*(float *)CONCAT44(extraout_var,iVar1);
          free(local_c8);
        }
      }
    }
    free(local_a0.m_data);
  }
  free(local_90[0]);
  free(local_118[0]);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_e0);
  return local_120;
}

Assistant:

static double convolution_sum_h(const vector &p, const L *lattice, const double &h) {
            auto sites = BF::template get_integer_support<N>();
            lattice_site c = lattice->get_nearest_site(p);
            lattice_site extent = lattice->get_dimensions();

            double value = 0;

            for(lattice_site s : sites) {

                if(!lattice->is_lattice_site(c+s)) continue;
                if(!lattice->is_filled(c+s)) continue;


                double w = BF::template phi<N>(h, p - (c+s).cast<double>());
                if(w == 0.) continue;
                value += w * (*lattice)(c + s);
            }
            return value;
        }